

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 15-extract-function.cpp
# Opt level: O0

void fun(env *lest_env,int a,int b)

{
  ostream *os;
  bool bVar1;
  failure *this;
  undefined1 local_230 [72];
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  location local_1a0;
  message local_178;
  undefined1 local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  location local_88;
  expression_decomposer local_49;
  int *local_48;
  undefined1 local_40 [8];
  result score;
  int b_local;
  int a_local;
  env *lest_env_local;
  
  score._32_4_ = b;
  score._36_4_ = a;
  do {
    local_48 = (int *)lest::expression_decomposer::operator<<(&local_49,(int *)&score.field_0x24);
    lest::expression_lhs<int_const&>::operator==
              ((result *)local_40,(expression_lhs<int_const&> *)&local_48,(int *)&score.field_0x20);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_40);
    if (bVar1) {
      local_f9 = 1;
      this = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/15-extract-function.cpp"
                 ,&local_a9);
      lest::location::location(&local_88,(text *)local_a8,0xb);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"a == b",&local_d1);
      std::__cxx11::string::string(local_f8,(string *)&score);
      lest::failure::failure(this,&local_88,(text *)local_d0,(text *)local_f8);
      local_f9 = 0;
      __cxa_throw(this,&lest::failure::typeinfo,lest::failure::~failure);
    }
    bVar1 = lest::env::pass(lest_env);
    if (bVar1) {
      os = lest_env->os;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/15-extract-function.cpp"
                 ,&local_1c1);
      lest::location::location(&local_1a0,(text *)local_1c0,0xb);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"a == b",(allocator *)(local_230 + 0x47));
      std::__cxx11::string::string((string *)(local_230 + 0x20),(string *)&score);
      bVar1 = lest::env::zen(lest_env);
      lest::passing::passing
                ((passing *)&local_178,&local_1a0,(text *)local_1e8,(text *)(local_230 + 0x20),bVar1
                );
      lest::env::context_abi_cxx11_((env *)local_230);
      lest::report(os,&local_178,(text *)local_230);
      std::__cxx11::string::~string((string *)local_230);
      lest::passing::~passing((passing *)&local_178);
      std::__cxx11::string::~string((string *)(local_230 + 0x20));
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)(local_230 + 0x47));
      lest::location::~location(&local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    }
    lest::result::~result((result *)local_40);
    bVar1 = lest::is_false();
  } while (bVar1);
  return;
}

Assistant:

void fun( lest::env & lest_env, int a, int b )
{
    EXPECT( a == b );
}